

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ADE.h
# Opt level: O1

Permutazione * __thiscall
ADE<Permutazione>::esegui
          (Permutazione *__return_storage_ptr__,ADE<Permutazione> *this,unsigned_short nIndividui,
          unsigned_long_long tempoDisponibileMs,double theta,double Fmin,double Fmax,
          bool normalizzazione,uint s)

{
  uint uVar1;
  void *pvVar2;
  ulong uVar3;
  uint uVar4;
  undefined8 *puVar5;
  undefined8 *puVar6;
  void *pvVar7;
  void *pvVar8;
  IndiciRandom *pIVar9;
  short sVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  bool bVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  unsigned_short treIndici [3];
  Permutazione *migliorIndividuo;
  uniform_int_distribution<int> local_b0;
  void *local_a8;
  void *local_a0;
  unsigned_long_long local_98;
  undefined8 *local_90;
  void *local_88;
  uint local_7c;
  ushort local_76;
  ushort local_74;
  Permutazione *local_70;
  ulong local_68;
  double local_60;
  long local_58;
  double local_50;
  double local_48;
  ulong local_40;
  undefined8 *local_38;
  
  uVar11 = (ulong)s;
  uVar4 = (uint)nIndividui;
  local_98 = tempoDisponibileMs;
  local_70 = __return_storage_ptr__;
  local_50 = Fmax;
  local_48 = theta;
  local_58 = std::chrono::_V2::system_clock::now();
  this->seed = s;
  if (s != 0) {
    lVar13 = 1;
    genRand.gen._M_x[0] = uVar11;
    do {
      uVar11 = (ulong)(((uint)(uVar11 >> 0x1e) ^ (uint)uVar11) * 0x6c078965 + (int)lVar13);
      genRand.gen._M_x[lVar13] = uVar11;
      lVar13 = lVar13 + 1;
    } while (lVar13 != 0x270);
    genRand.gen._M_p = 0x270;
  }
  uVar14 = (ulong)nIndividui;
  uVar11 = (ulong)(uVar4 * 8);
  puVar5 = (undefined8 *)operator_new__(uVar11);
  puVar6 = (undefined8 *)operator_new__((ulong)(uVar4 * 8 + 8));
  (**this->_vptr_ADE)(this,puVar5,uVar14);
  local_90 = puVar6;
  (**this->_vptr_ADE)(this,puVar6,(ulong)(uVar4 + 1 & 0xffff));
  local_a8 = operator_new__(uVar11);
  local_a0 = operator_new__(uVar11);
  local_88 = operator_new__(uVar14);
  pvVar7 = operator_new__(uVar11);
  pvVar8 = operator_new__(uVar11);
  local_7c = (uint)normalizzazione;
  (*this->_vptr_ADE[1])(this,puVar5,uVar14);
  pIVar9 = (IndiciRandom *)operator_new(0x18);
  IndiciRandom::IndiciRandom(pIVar9,&genRand,nIndividui);
  this->indiciRandom = pIVar9;
  if (nIndividui != 0) {
    uVar11 = 0;
    do {
      *(undefined8 *)((long)pvVar7 + uVar11 * 8) = 0x3fe0000000000000;
      *(undefined8 *)((long)pvVar8 + uVar11 * 8) = 0x3fe0000000000000;
      uVar11 = uVar11 + 1;
    } while (uVar14 != uVar11);
  }
  local_58 = local_58 + local_98 * 1000000;
  std::chrono::_V2::system_clock::now();
  local_38 = puVar5 + uVar14;
  lVar13 = 0x3f;
  if (uVar14 != 0) {
    for (; nIndividui >> lVar13 == 0; lVar13 = lVar13 + -1) {
    }
  }
  local_40 = (ulong)(((uint)lVar13 ^ 0x3f) * 2) ^ 0x7e;
  local_98 = CONCAT44(local_98._4_4_,uVar4 - 1);
  local_68 = 0;
  do {
    puVar6 = local_38;
    if (nIndividui != 0) {
      std::
      __introsort_loop<Permutazione**,long,__gnu_cxx::__ops::_Iter_comp_iter<ADE<Permutazione>::esegui(unsigned_short,unsigned_long_long,double,double,double,bool,unsigned_int)::_lambda(Permutazione*,Permutazione*)_1_>>
                (puVar5,local_38,local_40);
      std::
      __final_insertion_sort<Permutazione**,__gnu_cxx::__ops::_Iter_comp_iter<ADE<Permutazione>::esegui(unsigned_short,unsigned_long_long,double,double,double,bool,unsigned_int)::_lambda(Permutazione*,Permutazione*)_1_>>
                (puVar5,puVar6);
    }
    lVar13 = std::chrono::_V2::system_clock::now();
    pvVar2 = local_a8;
    dVar17 = (double)(local_58 - lVar13) / 1000000000.0;
    if (0.0 < dVar17) {
      puVar6 = local_90;
      local_60 = dVar17;
      if (nIndividui != 0) {
        uVar11 = 0;
        do {
          local_b0._M_param._M_a = 0;
          local_b0._M_param._M_b = (int)local_98;
          uVar4 = std::uniform_int_distribution<int>::operator()
                            (&local_b0,&genRand.gen,&local_b0._M_param);
          do {
            dVar17 = *(double *)((long)pvVar7 + (ulong)(uVar4 & 0xffff) * 8);
            do {
              dVar16 = std::
                       generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                                 (&genRand.gen);
            } while (dVar16 == 0.5);
            dVar16 = tan(dVar16 * 3.141592653589793);
            dVar17 = dVar16 * 0.1 + dVar17;
          } while (dVar17 < 0.0);
          if (local_50 <= dVar17) {
            dVar17 = local_50;
          }
          *(double *)((long)pvVar2 + uVar11 * 8) = dVar17;
          local_b0._M_param._M_a = 0;
          local_b0._M_param._M_b = (int)local_98;
          uVar4 = std::uniform_int_distribution<int>::operator()
                            (&local_b0,&genRand.gen,&local_b0._M_param);
          do {
            dVar17 = *(double *)((long)pvVar8 + (ulong)(uVar4 & 0xffff) * 8);
            do {
              dVar16 = std::
                       generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                                 (&genRand.gen);
            } while (dVar16 == 0.5);
            dVar16 = tan(dVar16 * 3.141592653589793);
            puVar6 = local_90;
            dVar17 = dVar16 * 0.1 + dVar17;
          } while (dVar17 < 0.0);
          if (local_50 <= dVar17) {
            dVar17 = local_50;
          }
          *(double *)((long)local_a0 + uVar11 * 8) = dVar17;
          uVar11 = uVar11 + 1;
        } while (uVar11 != uVar14);
        if (nIndividui != 0) {
          uVar11 = 0;
          do {
            IndiciRandom::generaIndici(this->indiciRandom,&local_76,3);
            (**(code **)(*(long *)puVar6[uVar11] + 0x10))((long *)puVar6[uVar11],puVar5[local_76]);
            Permutazione::differenza
                      ((Permutazione *)puVar6[uVar11],(Permutazione *)puVar5[local_74]);
            (**(code **)(*(long *)puVar6[uVar11] + 0x18))
                      (*(undefined8 *)((long)local_a0 + uVar11 * 8));
            (**(code **)(*(long *)puVar6[uVar11 + 1] + 0x10))((long *)puVar6[uVar11 + 1],*puVar5);
            Permutazione::differenza
                      ((Permutazione *)puVar6[uVar11 + 1],(Permutazione *)puVar5[uVar11]);
            (**(code **)(*(long *)puVar6[uVar11 + 1] + 0x18))
                      (*(undefined8 *)((long)local_a8 + uVar11 * 8));
            Permutazione::somma((Permutazione *)puVar6[uVar11],(Permutazione *)puVar6[uVar11 + 1]);
            Permutazione::somma((Permutazione *)puVar6[uVar11],(Permutazione *)puVar5[uVar11]);
            uVar11 = uVar11 + 1;
          } while (uVar14 != uVar11);
        }
      }
      (*this->_vptr_ADE[6])(this,*puVar6);
      (*this->_vptr_ADE[4])(local_48,this,puVar5,puVar6,uVar14,(ulong)local_7c,local_88);
      if (nIndividui == 0) {
        bVar15 = true;
        dVar19 = 0.0;
        dVar20 = 0.0;
        dVar18 = 0.0;
        dVar16 = 0.0;
      }
      else {
        dVar16 = 0.0;
        uVar11 = 0;
        sVar10 = 0;
        dVar18 = 0.0;
        dVar20 = 0.0;
        dVar19 = 0.0;
        do {
          if (*(char *)((long)local_88 + uVar11) == '\x01') {
            dVar17 = *(double *)((long)local_a8 + uVar11 * 8);
            dVar20 = dVar20 + dVar17;
            dVar19 = dVar19 + dVar17 * dVar17;
            dVar17 = *(double *)((long)local_a0 + uVar11 * 8);
            dVar16 = dVar16 + dVar17;
            dVar18 = dVar18 + dVar17 * dVar17;
            sVar10 = sVar10 + 1;
          }
          uVar11 = uVar11 + 1;
        } while (uVar14 != uVar11);
        bVar15 = sVar10 == 0;
      }
      dVar17 = local_60;
      if (!bVar15) {
        *(double *)((long)pvVar7 + (ulong)((uint)(ushort)local_68 * 8)) = dVar19 / dVar20;
        *(double *)((long)pvVar8 + (ulong)((uint)(ushort)local_68 * 8)) = dVar18 / dVar16;
        local_68 = (ulong)((ushort)local_68 + 1) % uVar14;
      }
    }
  } while (0.0 < dVar17);
  if (nIndividui == 0) {
    uVar11 = 0;
  }
  else {
    uVar4 = 0xffffffff;
    uVar12 = 0;
    uVar11 = 0;
    do {
      uVar1 = *(uint *)(puVar5[uVar12] + 0x14);
      bVar15 = uVar1 < uVar4;
      if (bVar15) {
        uVar4 = uVar1;
      }
      uVar3 = uVar12 & 0xffffffff;
      if (!bVar15) {
        uVar3 = uVar11;
      }
      uVar11 = uVar3;
      uVar12 = uVar12 + 1;
    } while (uVar14 != uVar12);
    uVar11 = uVar11 & 0xffff;
  }
  (*this->_vptr_ADE[6])(this,puVar5[uVar11]);
  Permutazione::Permutazione(local_70,(Permutazione *)puVar5[uVar11]);
  puVar6 = local_90;
  pvVar2 = local_a8;
  if (nIndividui != 0) {
    uVar11 = 0;
    do {
      if ((long *)puVar5[uVar11] != (long *)0x0) {
        (**(code **)(*(long *)puVar5[uVar11] + 8))();
      }
      if ((long *)puVar6[uVar11] != (long *)0x0) {
        (**(code **)(*(long *)puVar6[uVar11] + 8))();
      }
      uVar11 = uVar11 + 1;
    } while (uVar14 != uVar11);
  }
  if ((long *)puVar6[uVar14] != (long *)0x0) {
    (**(code **)(*(long *)puVar6[uVar14] + 8))();
  }
  operator_delete__(puVar5);
  operator_delete__(puVar6);
  operator_delete__(pvVar2);
  operator_delete__(local_a0);
  operator_delete__(pvVar7);
  operator_delete__(pvVar8);
  operator_delete__(local_88);
  pIVar9 = this->indiciRandom;
  if (pIVar9 != (IndiciRandom *)0x0) {
    IndiciRandom::~IndiciRandom(pIVar9);
    operator_delete(pIVar9,0x18);
  }
  return local_70;
}

Assistant:

T esegui(unsigned short nIndividui, unsigned long long tempoDisponibileMs, double theta, double Fmin, 
			double Fmax, bool normalizzazione, unsigned int s) {

			using orologio = std::chrono::system_clock;
			auto tempoFinale = orologio::now() + chrono::milliseconds(tempoDisponibileMs);
			using sec = std::chrono::duration<double>;

			seed = s;
			if(seed > 0) genRand.impostaSeed(seed);

			T** popolazione = new T * [nIndividui];
			T** popolazioneAlternativa = new T * [nIndividui + 1];

			creaPopolazione(popolazione, nIndividui);

			//L'ultimo elemento � di appoggio
			creaPopolazione(popolazioneAlternativa, nIndividui + 1);

			double* vettoreF1 = new double[nIndividui];
			double* vettoreF2 = new double[nIndividui];

			bool* vettoreSuccessi = new bool[nIndividui];

			unsigned short h = nIndividui;
			double* vettoreM1 = new double[h];
			double* vettoreM2 = new double[h];

			inizializzaPopolazione(popolazione, nIndividui, normalizzazione);

			//stampa(popolazione, nIndividui);

			indiciRandom = new IndiciRandom(&genRand, nIndividui);

			for (unsigned short i = 0; i < h; i++) {
				vettoreM1[i] = 0.5;
				vettoreM2[i] = 0.5;
			}

			unsigned short treIndici[3];

			unsigned int contatore = 0;
			sec tempoDisponibile = tempoFinale - orologio::now();

			unsigned short posizione = 0;


			while (true) {

				sort(popolazione, popolazione + nIndividui, [](T* p1, T* p2) -> bool {
					return p1->score < p2->score;
				});

				sec tempoRimasto = tempoFinale - orologio::now();
				auto count = tempoRimasto.count();
				if (count <= 0.)
					break;

				//cout << "Tempo rimasto: " << (unsigned int)count << " secondi \t\r";
				//stampa(popolazione, nIndividui);

				unsigned short indiceRandom;
				double valoreRandom;

				for (unsigned short i = 0; i < nIndividui; i++) {

					indiceRandom = genRand.randIntU(0, h - 1);

					do {
						valoreRandom = genRand.cauchy(vettoreM1[indiceRandom], 0.1);
					} while (valoreRandom < 0);

					vettoreF1[i] = min(Fmax, valoreRandom);

					indiceRandom = genRand.randIntU(0, h - 1);

					do {
						valoreRandom = genRand.cauchy(vettoreM2[indiceRandom], 0.1);
					} while (valoreRandom < 0);
	
					vettoreF2[i] = min(Fmax, valoreRandom);
				}

				for (unsigned short i = 0; i < nIndividui; i++) {
					indiciRandom->generaIndici(treIndici, 3);

					*popolazioneAlternativa[i] = *(popolazione[treIndici[0]]);
					popolazioneAlternativa[i]->differenza(popolazione[treIndici[1]]);
					popolazioneAlternativa[i]->prodotto(vettoreF2[i]);

					*popolazioneAlternativa[i + 1] = *(popolazione[0]);
					popolazioneAlternativa[i + 1]->differenza(popolazione[i]);
					popolazioneAlternativa[i + 1]->prodotto(vettoreF1[i]);

					popolazioneAlternativa[i]->somma(popolazioneAlternativa[i + 1]);
					popolazioneAlternativa[i]->somma(popolazione[i]);
				}

				ricercaLocale(popolazioneAlternativa[0]);

				selezionaPopolazione(popolazione, popolazioneAlternativa, nIndividui, theta, normalizzazione, vettoreSuccessi);

				double sQ1 = 0, s1 = 0, sQ2 = 0, s2 = 0;

				unsigned short contatore = 0;
				for (unsigned short i = 0; i < nIndividui; i++) {
					if (vettoreSuccessi[i]) {
						sQ1 += pow(vettoreF1[i], 2);
						s1 += vettoreF1[i];
						sQ2 += pow(vettoreF2[i], 2);
						s2 += vettoreF2[i];
						contatore++;
					}
				}

				if (contatore != 0) {
					double mediaP = sQ1 / s1;
					vettoreM1[posizione] = mediaP;

					mediaP = sQ2 / s2;
					vettoreM2[posizione] = mediaP;

					posizione = (posizione + 1) % h;
				}
				
			}

			//cout << endl << endl;

			//Troviamo l'individuo migliore
			unsigned int migliorPunteggioIniziale = UINT32_MAX;
			unsigned short migliore = 0;

			for (unsigned short i = 0; i < nIndividui; i++) {
				if (popolazione[i]->score < migliorPunteggioIniziale) {
					migliorPunteggioIniziale = popolazione[i]->score;
					migliore = i;
				}
			}

			ricercaLocale(popolazione[migliore]);

			//stampa(popolazione, nIndividui);

			T migliorIndividuo = *(popolazione[migliore]);

			for (unsigned int i = 0; i < nIndividui; i++) {
				delete popolazione[i];
				delete popolazioneAlternativa[i];
			}
			delete popolazioneAlternativa[nIndividui];

			delete[] popolazione;
			delete[] popolazioneAlternativa;

			delete[] vettoreF1;
			delete[] vettoreF2;
			delete[] vettoreM1;
			delete[] vettoreM2;
			delete[] vettoreSuccessi;

			delete indiciRandom;

			return migliorIndividuo;
		}